

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

void __thiscall ON_Layer::UnsetPerViewportPersistentVisibility(ON_Layer *this,ON_UUID viewport_id)

{
  bool bVar1;
  ON__LayerExtensions *pOVar2;
  ON__LayerPerViewSettings *pOVar3;
  long lVar4;
  long lVar5;
  undefined1 in_R9B;
  ON_UUID viewport_id_00;
  uchar *local_18;
  uchar local_10 [8];
  
  local_10 = viewport_id.Data4;
  local_18 = viewport_id._0_8_;
  bVar1 = ON_UuidIsNil((ON_UUID *)&local_18);
  if (bVar1) {
    pOVar2 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
    if ((pOVar2 != (ON__LayerExtensions *)0x0) &&
       (lVar4 = (long)(pOVar2->m_vp_settings).m_count, 0 < lVar4)) {
      pOVar3 = (pOVar2->m_vp_settings).m_a;
      lVar5 = 0;
      do {
        *(uchar *)((long)(&pOVar3->m_viewport_id + 2) + lVar5 + 1) = '\0';
        lVar5 = lVar5 + 0x28;
      } while (lVar4 * 0x28 != lVar5);
    }
  }
  else {
    viewport_id_00.Data4[0] = '\0';
    viewport_id_00.Data4[1] = '\0';
    viewport_id_00.Data4[2] = '\0';
    viewport_id_00.Data4[3] = '\0';
    viewport_id_00.Data4[4] = '\0';
    viewport_id_00.Data4[5] = '\0';
    viewport_id_00.Data4[6] = '\0';
    viewport_id_00.Data4[7] = '\0';
    viewport_id_00._0_8_ = local_10;
    pOVar3 = ON__LayerExtensions::ViewportSettings
                       ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,local_18,
                        viewport_id_00,(bool)in_R9B);
    if (pOVar3 != (ON__LayerPerViewSettings *)0x0) {
      pOVar3->m_persistent_visibility = '\0';
    }
  }
  return;
}

Assistant:

void ON_Layer::UnsetPerViewportPersistentVisibility( ON_UUID viewport_id )
{
  // added to fix bug 82587
  if ( ON_UuidIsNil(viewport_id) )
  {
    ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions( *this, &m_extension_bits, false );
    if ( 0 != ud )
    {
      for ( int i = 0; i < ud->m_vp_settings.Count(); i++ )
      {
        ud->m_vp_settings[i].m_persistent_visibility = 0;
      }
    }
  }
  else
  {
    bool bCreate = false; // This "false" is correct because the per viewport visibility
                          // setting needs to be in existence for this call to make any
                          // sense in the first place.
    ON__LayerPerViewSettings* vp_settings = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, bCreate );
    if (vp_settings )
      vp_settings->m_persistent_visibility = 0;
  }
}